

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBHub.cpp
# Opt level: O0

long VRSFloatInt(uint8_t **pStart)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  long l;
  uint8_t **pStart_local;
  
  uVar3 = (ulong)**pStart << 0x10;
  bVar1 = (*pStart)[1];
  bVar2 = (*pStart)[2];
  l = uVar3 | (ulong)bVar1 << 8 | (ulong)bVar2;
  *pStart = *pStart + 3;
  if ((uVar3 & 0x800000) != 0) {
    l = -(uVar3 & 0x7fffff | (ulong)bVar1 << 8 | (ulong)bVar2);
  }
  return l;
}

Assistant:

long VRSFloatInt (const uint8_t* &pStart)
{
    long l = long((unsigned long)(pStart[0]) << 16 |
                  (unsigned long)(pStart[1]) <<  8 |
                  (unsigned long)(pStart[2]));
    pStart += 3;                        // eat the number
    // test for negative value
    if (l & 0x800000) {
        l &= 0x7fffffL;                 // remove the negative flag
        l *= -1L;                       // make value negative
    }
    return l;
}